

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::stats_alert::message_abi_cxx11_(string *__return_storage_ptr__,stats_alert *this)

{
  value_type_conflict1 vVar1;
  value_type_conflict1 vVar2;
  value_type_conflict1 vVar3;
  value_type_conflict1 vVar4;
  uint *puVar5;
  const_reference pvVar6;
  value_type_conflict1 local_1f8 [2];
  value_type_conflict1 local_1f0;
  value_type_conflict1 local_1e8;
  value_type_conflict1 local_1e0;
  value_type_conflict1 local_1d8;
  value_type_conflict1 local_1d0;
  value_type_conflict1 local_1c8;
  value_type_conflict1 local_1c0;
  value_type_conflict1 local_1b8;
  string *local_1a8;
  stats_alert *local_1a0;
  array<int,_10UL> *local_198;
  value_type_conflict1 local_190;
  value_type_conflict1 local_18c;
  value_type_conflict1 local_188;
  value_type_conflict1 local_184;
  undefined8 local_180;
  uint local_174;
  uint local_170;
  undefined4 local_16c;
  undefined1 *local_168;
  string *local_160;
  string *local_158;
  char *local_150;
  allocator<char> *local_148;
  allocator<char> local_129;
  string local_128;
  char local_108 [8];
  char msg [200];
  stats_alert *this_local;
  
  local_160 = &local_128;
  local_1a8 = __return_storage_ptr__;
  local_1a0 = this;
  local_158 = __return_storage_ptr__;
  msg._192_8_ = this;
  torrent_alert::message_abi_cxx11_(local_160,&this->super_torrent_alert);
  local_180 = std::__cxx11::string::c_str();
  local_174 = local_1a0->interval;
  local_198 = &local_1a0->transferred;
  local_16c = 0;
  puVar5 = (uint *)std::array<int,_10UL>::operator[](local_198,0);
  local_170 = *puVar5;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,1);
  local_184 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,2);
  local_188 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,3);
  local_18c = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,4);
  local_190 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,5);
  vVar1 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,6);
  vVar2 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,7);
  vVar3 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,8);
  vVar4 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](local_198,9);
  local_1b8 = *pvVar6;
  local_1e0 = local_190;
  local_1e8 = local_18c;
  local_1f0 = local_188;
  local_1f8[0] = local_184;
  local_150 = local_108;
  local_1d8 = vVar1;
  local_1d0 = vVar2;
  local_1c8 = vVar3;
  local_1c0 = vVar4;
  local_168 = (undefined1 *)local_1f8;
  snprintf(local_150,200,"%s: [%d] %d %d %d %d %d %d %d %d %d %d",local_180,(ulong)local_174,
           (ulong)local_170);
  std::__cxx11::string::~string((string *)local_160);
  local_148 = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_158,local_150,local_148);
  std::allocator<char>::~allocator(&local_129);
  return local_1a8;
}

Assistant:

std::string stats_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), "%s: [%d] %d %d %d %d %d %d"
#if TORRENT_ABI_VERSION == 1
			" %d %d %d %d"
#endif
			, torrent_alert::message().c_str()
			, interval
			, transferred[0]
			, transferred[1]
			, transferred[2]
			, transferred[3]
			, transferred[4]
			, transferred[5]
#if TORRENT_ABI_VERSION == 1
			, transferred[6]
			, transferred[7]
			, transferred[8]
			, transferred[9]
#endif
			);
		return msg;
	}